

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O0

bool Cipher::loadFreqMap(char *fname,TFreqMap *res)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  reference pvVar6;
  undefined8 uVar7;
  reference pdVar8;
  int *in_RSI;
  char *in_RDI;
  double dVar9;
  double *p;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  TCode idx;
  int32_t nfreq;
  string gram;
  ifstream fin;
  vector<double,_std::allocator<double>_> *prob;
  TGramLen *len;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd28;
  int n;
  int in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  undefined7 in_stack_fffffffffffffd50;
  size_type in_stack_fffffffffffffd58;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_298;
  vector<double,_std::allocator<double>_> *local_290;
  TCode local_284;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 local_270;
  int local_264;
  string local_260 [32];
  undefined4 local_240;
  long local_230 [65];
  vector<double,_std::allocator<double>_> *local_28;
  int *local_20;
  int *local_18;
  char *local_10;
  byte local_1;
  
  local_28 = (vector<double,_std::allocator<double>_> *)(in_RSI + 6);
  *in_RSI = 0;
  local_20 = in_RSI;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x1a7276);
  printf("[+] Loading n-gram file \'%s\'\n",local_10);
  std::ifstream::ifstream(local_230,local_10,_S_in);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    printf("    Failed to open file\n");
    local_1 = 0;
    local_240 = 1;
  }
  else {
    std::__cxx11::string::string(local_260);
    local_264 = 0;
    local_18[4] = 0;
    local_18[5] = 0;
    while( true ) {
      piVar5 = std::operator>>((istream *)local_230,local_260);
      std::istream::operator>>(piVar5,&local_264);
      bVar2 = std::ios::eof();
      if ((bVar2 & 1) != 0) break;
      *(long *)(local_18 + 4) = (long)local_264 + *(long *)(local_18 + 4);
    }
    std::ios::clear((long)local_230 + *(long *)(local_230[0] + -0x18),0);
    std::fpos<__mbstate_t>::fpos
              ((fpos<__mbstate_t> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (streamoff)in_stack_fffffffffffffd28);
    std::istream::seekg(local_230,local_278,local_270);
    while( true ) {
      piVar5 = std::operator>>((istream *)local_230,local_260);
      std::istream::operator>>(piVar5,&local_264);
      bVar2 = std::ios::eof();
      in_stack_fffffffffffffd34 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd34);
      if ((bVar2 & 1) != 0) break;
      if (*local_20 == 0) {
        iVar4 = std::__cxx11::string::size();
        n = (int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
        *local_20 = iVar4;
        local_280 = 0x3ff0000000000000;
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                   (value_type_conflict4 *)CONCAT17(bVar1,in_stack_fffffffffffffd50));
      }
      else {
        in_stack_fffffffffffffd30 = *local_20;
        iVar4 = std::__cxx11::string::size();
        n = (int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
        if (in_stack_fffffffffffffd30 != iVar4) {
          printf("Error: loaded n-grams with vaying lengths\n");
          local_1 = 0;
          goto LAB_001a76d7;
        }
      }
      std::__cxx11::string::data();
      local_284 = calcCode((char *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),n);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_284);
      if (*pvVar6 <= 0.5 && *pvVar6 != 0.5) {
        uVar7 = std::__cxx11::string::c_str();
        printf("Error: duplicate n-gram \'%s\'\n",uVar7);
        local_1 = 0;
        goto LAB_001a76d7;
      }
      in_stack_fffffffffffffd28 =
           (vector<double,_std::allocator<double>_> *)
           log10((double)local_264 / (double)*(long *)(local_18 + 4));
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_284);
      *pvVar6 = (value_type)in_stack_fffffffffffffd28;
    }
    printf("    Total n-grams loaded = %g\n",(double)*(long *)(local_18 + 4));
    dVar9 = log(10000000.01 / (double)*(long *)(local_18 + 4));
    *(double *)(local_18 + 2) = dVar9;
    printf("    P-min = %g\n",*(undefined8 *)(local_18 + 2));
    local_290 = local_28;
    local_298._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffd28);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffd28);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                              (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_fffffffffffffd28), bVar3) {
      pdVar8 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_298);
      if (0.5 <= *pdVar8) {
        *pdVar8 = *(double *)(local_18 + 2);
      }
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_298);
    }
    local_1 = 1;
LAB_001a76d7:
    local_240 = 1;
    std::__cxx11::string::~string(local_260);
  }
  std::ifstream::~ifstream(local_230);
  return (bool)(local_1 & 1);
}

Assistant:

bool loadFreqMap(const char * fname, TFreqMap & res) {
        auto & len = res.len;
        auto & prob = res.prob;

        len = 0;
        prob.clear();

        printf("[+] Loading n-gram file '%s'\n", fname);
        std::ifstream fin(fname);

        if (fin.good() == false) {
            printf("    Failed to open file\n");
            return false;
        }

        std::string gram;
        int32_t nfreq = 0;
        res.nTotal = 0;

        while (true) {
            fin >> gram >> nfreq;
            if (fin.eof()) break;

            res.nTotal += nfreq;
        }

        fin.clear();
        fin.seekg(0);

        while (true) {
            fin >> gram >> nfreq;
            if (fin.eof()) break;

            if (len == 0) {
                len = gram.size();
                prob.resize(1 << (5*len), 1.0);
            } else if (len != (int) gram.size()) {
                printf("Error: loaded n-grams with vaying lengths\n");
                return false;
            }

            TCode idx = calcCode(gram.data(), len);
            if (prob[idx] < 0.5) {
                printf("Error: duplicate n-gram '%s'\n", gram.c_str());
                return false;
            }
            prob[idx] = std::log10(((double)(nfreq))/res.nTotal);
        }
        printf("    Total n-grams loaded = %g\n", (double) res.nTotal);

        res.pmin = std::log(10000000.01/res.nTotal);
        printf("    P-min = %g\n", res.pmin);
        for (auto & p : prob) {
            if (p >= 0.5) p = res.pmin;
        }

        return true;
    }